

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule7Test::verifyResultData
          (TessellationShaderInvarianceRule7Test *this,void **all_iterations_data)

{
  float *tessellated_vertex_data;
  pointer *this_00;
  long lVar1;
  void *pvVar2;
  float *vertex_data;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  MessageBuilder *pMVar11;
  TestError *this_01;
  byte bVar12;
  int iVar13;
  pointer piVar14;
  int iVar15;
  float *value;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  TessellationShaderInvarianceRule7Test *this_02;
  _tessellation_primitive_mode primitive_mode;
  char *pcVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float *base_triangle_vertex3;
  float *base_triangle_vertex2;
  float *base_triangle_vertex1;
  long local_250;
  long local_248;
  ulong local_240;
  float *local_238;
  uint local_22c;
  ulong local_228;
  TessellationShaderInvarianceRule7Test *local_220;
  float *local_218;
  long local_210;
  vector<int,_std::allocator<int>_> ref_iteration_indices;
  vector<const_float_*,_std::allocator<const_float_*>_> outer_edge_vertices;
  undefined1 auVar28 [16];
  
  uVar16 = 0;
  local_220 = this;
  do {
    if ((int)uVar16 == 2) {
      return;
    }
    uVar9 = 0;
    if ((int)uVar16 == 0) {
      local_248 = 0x2e0;
      primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      uVar8 = 3;
      local_250 = 0;
    }
    else {
      local_250 = ((long)(this->m_test_triangles_iterations).
                         super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_test_triangles_iterations).
                        super__Vector_base<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x2c;
      local_248 = 0x2f8;
      primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
      uVar8 = 4;
    }
    local_240 = uVar16;
    local_22c = uVar8;
    while( true ) {
      local_228 = (ulong)uVar9;
      lVar1 = *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase
                               .super_TestCase.super_TestNode._vptr_TestNode + local_248);
      if ((ulong)((*(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                    super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx +
                            local_248) - lVar1) / 0x2c) <= local_228) break;
      ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(char *)(lVar1 + 0x20 + local_228 * 0x2c) == '\x01') {
        local_238 = (float *)(lVar1 + local_228 * 0x2c);
        local_218 = local_238 + 2;
        for (iVar15 = 1; iVar15 - uVar8 != 1; iVar15 = iVar15 + 1) {
          uVar9 = getTestIterationIndex
                            (this,(int)uVar16 == 0,local_238,local_218,
                             (_tessellation_shader_vertex_ordering)local_238[7],
                             (uint)((int)local_238[9] + iVar15) % local_22c);
          outer_edge_vertices.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(outer_edge_vertices.
                                 super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar9);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&ref_iteration_indices,(int *)&outer_edge_vertices);
        }
        iVar15 = (int)local_228;
        iVar13 = (int)local_250;
        value = local_238;
        for (piVar14 = ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar14 !=
            ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar14 = piVar14 + 1) {
          local_210 = (long)*piVar14 * 0x2c +
                      *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                       super_TestCaseBase.super_TestCase.super_TestNode.
                                       _vptr_TestNode + local_248);
          pvVar2 = all_iterations_data[(uint)(iVar15 + iVar13)];
          vertex_data = (float *)all_iterations_data[(uint)(*piVar14 + (int)local_250)];
          for (uVar16 = 0; uVar16 < (ulong)(uint)value[10] / 3; uVar16 = uVar16 + 1) {
            uVar10 = (ulong)(uint)((int)uVar16 * 9);
            tessellated_vertex_data = (float *)((long)pvVar2 + uVar10 * 4);
            base_triangle_vertex2 = (float *)((long)pvVar2 + uVar10 * 4 + 0xc);
            base_triangle_vertex3 = (float *)((long)pvVar2 + uVar10 * 4 + 0x18);
            base_triangle_vertex1 = tessellated_vertex_data;
            bVar4 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode,tessellated_vertex_data);
            bVar5 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,base_triangle_vertex2)
            ;
            this_02 = (TessellationShaderInvarianceRule7Test *)(ulong)primitive_mode;
            bVar6 = TessellationShaderUtils::isOuterEdgeVertex(primitive_mode,base_triangle_vertex3)
            ;
            if (bVar6 || (char)(bVar5 + bVar4) != '\0') {
              if ((int)local_240 == 0) {
                if ((bVar4) && ((*base_triangle_vertex1 != 0.0 || (NAN(*base_triangle_vertex1))))) {
LAB_00d04cd7:
                  if ((base_triangle_vertex1[1] == 0.0) && (!NAN(base_triangle_vertex1[1]))) {
LAB_00d04ce7:
                    if (((!bVar5) ||
                        ((base_triangle_vertex2[1] == 0.0 && (!NAN(base_triangle_vertex2[1]))))) &&
                       ((uVar9 = 1, !bVar6 ||
                        ((base_triangle_vertex3[1] == 0.0 && (!NAN(base_triangle_vertex3[1])))))))
                    goto LAB_00d04c3b;
                  }
                  uVar9 = 2;
                }
                else if (((bVar5) &&
                         ((*base_triangle_vertex2 != 0.0 || (NAN(*base_triangle_vertex2))))) ||
                        ((uVar9 = 0, bVar6 &&
                         ((*base_triangle_vertex3 != 0.0 || (NAN(*base_triangle_vertex3))))))) {
                  if (bVar4) goto LAB_00d04cd7;
                  goto LAB_00d04ce7;
                }
              }
              else {
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (bVar4) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            (&outer_edge_vertices,&base_triangle_vertex1);
                }
                if (bVar5) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            (&outer_edge_vertices,&base_triangle_vertex2);
                }
                if (bVar6) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            (&outer_edge_vertices,&base_triangle_vertex3);
                }
                bVar7 = 1;
                bVar12 = 1;
                bVar4 = true;
                for (uVar9 = 0;
                    (ulong)uVar9 <
                    (ulong)((long)outer_edge_vertices.
                                  super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)outer_edge_vertices.
                                  super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
                {
                  fVar22 = *outer_edge_vertices.
                            super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9];
                  fVar24 = outer_edge_vertices.
                           super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar9][1];
                  fVar25 = fVar22 + -1.0;
                  fVar23 = -fVar25;
                  if (-fVar25 <= fVar25) {
                    fVar23 = fVar25;
                  }
                  bVar7 = bVar7 & fVar23 <= 1e-05;
                  auVar27._0_4_ = -fVar24;
                  auVar27._4_4_ = 0x80000000;
                  auVar27._8_4_ = 0x80000000;
                  auVar27._12_4_ = 0x80000000;
                  if (auVar27._0_4_ <= fVar24) {
                    auVar27._0_4_ = fVar24;
                  }
                  fVar24 = -fVar22;
                  if (-fVar22 <= fVar22) {
                    fVar24 = fVar22;
                  }
                  bVar12 = bVar12 & auVar27._0_4_ <= 1e-05;
                  bVar4 = (bool)(bVar4 & fVar24 <= 1e-05);
                }
                if ((long)outer_edge_vertices.
                          super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)outer_edge_vertices.
                          super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                          super__Vector_impl_data._M_start == 8) {
                  uVar10 = *(ulong *)*outer_edge_vertices.
                                      super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                  fVar24 = (float)(uVar10 >> 0x20);
                  fVar22 = (float)uVar10 + -1.0;
                  auVar26._0_8_ = uVar10 ^ 0x8000000080000000;
                  auVar26._8_4_ = 0x80000000;
                  auVar26._12_4_ = 0x80000000;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = uVar10;
                  auVar27 = maxps(auVar26,auVar3);
                  iVar20 = -(uint)(1e-05 <= auVar27._0_4_);
                  iVar21 = -(uint)(1e-05 <= auVar27._4_4_);
                  auVar29._4_4_ = iVar21;
                  auVar29._0_4_ = iVar20;
                  auVar29._8_4_ = iVar21;
                  auVar29._12_4_ = iVar21;
                  auVar28._8_8_ = auVar29._8_8_;
                  auVar28._4_4_ = iVar20;
                  auVar28._0_4_ = iVar20;
                  iVar20 = movmskpd((int)*outer_edge_vertices.
                                          super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,auVar28);
                  if (iVar20 != 0) {
                    fVar23 = fVar24 + -1.0;
                    auVar30._0_8_ = CONCAT44(fVar24,fVar23) ^ 0x8000000080000000;
                    auVar30._8_4_ = -fVar24;
                    auVar30._12_4_ = -fVar24;
                    if (-fVar23 <= fVar23) {
                      auVar30._0_4_ = fVar23;
                    }
                    if ((~(byte)iVar20 & auVar30._0_4_ < 1e-05) == 0) {
                      fVar24 = -fVar22;
                      if (-fVar22 <= fVar22) {
                        fVar24 = fVar22;
                      }
                      bVar17 = (byte)iVar20 >> 1;
                      bVar18 = bVar17 ^ 1 | 1e-05 <= fVar24;
                      bVar7 = bVar7 & (1e-05 <= auVar30._0_4_ | bVar18);
                      if (bVar18 != 0) {
                        bVar12 = (1e-05 <= fVar24 | bVar17) & bVar12;
                      }
                    }
                    goto LAB_00d04c16;
                  }
LAB_00d04c1d:
                  uVar9 = 1;
                  if (bVar12 == 0) {
                    uVar9 = bVar7 ^ 3;
                  }
                }
                else {
LAB_00d04c16:
                  uVar9 = 0;
                  if (!bVar4) goto LAB_00d04c1d;
                }
                this_02 = (TessellationShaderInvarianceRule7Test *)&outer_edge_vertices;
                std::_Vector_base<const_float_*,_std::allocator<const_float_*>_>::~_Vector_base
                          ((_Vector_base<const_float_*,_std::allocator<const_float_*>_> *)this_02);
              }
LAB_00d04c3b:
              value = local_238;
              if ((uVar9 != *(uint *)(local_210 + 0x24)) &&
                 (bVar4 = isTriangleDefinedInVertexDataSet
                                    (this_02,tessellated_vertex_data,vertex_data,
                                     *(uint *)(local_210 + 0x28)), !bVar4)) {
                pcVar19 = "quads";
                if ((int)local_240 == 0) {
                  pcVar19 = "triangles";
                }
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((local_220->super_TessellationShaderInvarianceBaseTest).
                               super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
                this_00 = &outer_edge_vertices.
                           super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                std::operator<<((ostream *)this_00,"For primitive mode [");
                std::operator<<((ostream *)this_00,pcVar19);
                std::operator<<((ostream *)this_00,"] ");
                std::operator<<((ostream *)this_00,", inner tessellation levels:");
                std::operator<<((ostream *)this_00,"[");
                pMVar11 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)&outer_edge_vertices,value);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 1);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"], outer tessellation levels:");
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,local_218);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 3);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 4);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value + 5);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"], a triangle connecting inner & outer edges:");
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex1);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex1 + 1);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex1 + 2);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]x");
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex2);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex2 + 1);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex2 + 2);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]x");
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"[");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex3);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex3 + 1);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,", ");
                pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,base_triangle_vertex3 + 2);
                std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,
                                "] was not found for runs using CW and CCW vertex ordering, which is against the extension specification\'s rule 7."
                               );
                tcu::MessageBuilder::operator<<
                          (pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
                this_01 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_01,"Implementation is not conformant with Tessellation Rule 7",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                           ,0xc3d);
                __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
            }
          }
          this = local_220;
          uVar16 = local_240;
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>);
      uVar9 = (int)local_228 + 1;
    }
    uVar16 = (ulong)((int)uVar16 + 1);
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule7Test::verifyResultData(const void** all_iterations_data)
{
	const float epsilon = 1e-5f;

	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2 /* triangles, quads */; ++n_iteration)
	{
		bool			   is_triangles_iteration = (n_iteration == 0);
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();
		const unsigned int n_relevant_outer_tess_levels = (is_triangles_iteration) ? 3 : 4;

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		DE_ASSERT(test_iterations.size() != 0);

		/* Find a base iteration first */
		for (unsigned int n_base_test_iteration = 0; n_base_test_iteration < test_iterations.size();
			 n_base_test_iteration++)
		{
			const _test_iteration& base_iteration = test_iterations[n_base_test_iteration];
			std::vector<int>	   ref_iteration_indices;

			if (!base_iteration.is_base_iteration)
			{
				continue;
			}

			/* Retrieve reference test iterations */
			for (unsigned int n_reference_iteration = 0; n_reference_iteration < n_relevant_outer_tess_levels;
				 ++n_reference_iteration)
			{
				const unsigned int n_modified_outer_tess_level =
					(base_iteration.n_modified_outer_tess_level + n_reference_iteration + 1) %
					n_relevant_outer_tess_levels;
				const unsigned int ref_iteration_index = getTestIterationIndex(
					is_triangles_iteration, base_iteration.inner_tess_levels, base_iteration.outer_tess_levels,
					base_iteration.vertex_ordering, n_modified_outer_tess_level);

				DE_ASSERT(ref_iteration_index != 0xFFFFFFFF);
				DE_ASSERT(ref_iteration_index != n_base_test_iteration);

				ref_iteration_indices.push_back(ref_iteration_index);
			}

			/* We can now start comparing base data with the information generated for
			 * reference iterations. */
			for (std::vector<int>::const_iterator ref_iteration_iterator = ref_iteration_indices.begin();
				 ref_iteration_iterator != ref_iteration_indices.end(); ref_iteration_iterator++)
			{
				const int&			   n_ref_test_iteration = *ref_iteration_iterator;
				const _test_iteration& ref_iteration		= test_iterations[n_ref_test_iteration];

				/* Now move through all triangles generated for base test iteration. Focus on the ones
				 * that connect the outer edge with one of the inner ones */
				const float* base_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_base_test_iteration];
				const float* ref_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_ref_test_iteration];

				for (unsigned int n_base_triangle = 0;
					 n_base_triangle < base_iteration.n_vertices / 3; /* vertices per triangle */
					 ++n_base_triangle)
				{
					const float* base_triangle_data =
						base_iteration_vertex_data + n_base_triangle * 3 /* vertices */ * 3; /* components */

					/* Is that the triangle type we're after? */
					const float* base_triangle_vertex1 = base_triangle_data;
					const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
					const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */
					bool		 is_base_triangle_vertex1_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1);
					bool is_base_triangle_vertex2_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2);
					bool is_base_triangle_vertex3_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3);
					unsigned int n_outer_edge_vertices_found = 0;

					n_outer_edge_vertices_found += (is_base_triangle_vertex1_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex2_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex3_outer == true);

					if (n_outer_edge_vertices_found == 0)
					{
						/* This is an inner triangle, not really of our interest */
						continue;
					}

					/* Which outer tessellation level describes the base data edge? */
					unsigned int n_base_tess_level = 0;

					if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
					{
						if ((!is_base_triangle_vertex1_outer ||
							 (is_base_triangle_vertex1_outer && base_triangle_vertex1[0] == 0.0f)) &&
							(!is_base_triangle_vertex2_outer ||
							 (is_base_triangle_vertex2_outer && base_triangle_vertex2[0] == 0.0f)) &&
							(!is_base_triangle_vertex3_outer ||
							 (is_base_triangle_vertex3_outer && base_triangle_vertex3[0] == 0.0f)))
						{
							n_base_tess_level = 0;
						}
						else if ((!is_base_triangle_vertex1_outer ||
								  (is_base_triangle_vertex1_outer && base_triangle_vertex1[1] == 0.0f)) &&
								 (!is_base_triangle_vertex2_outer ||
								  (is_base_triangle_vertex2_outer && base_triangle_vertex2[1] == 0.0f)) &&
								 (!is_base_triangle_vertex3_outer ||
								  (is_base_triangle_vertex3_outer && base_triangle_vertex3[1] == 0.0f)))
						{
							n_base_tess_level = 1;
						}
						else
						{
							DE_ASSERT((!is_base_triangle_vertex1_outer ||
									   (is_base_triangle_vertex1_outer && base_triangle_vertex1[2] == 0.0f)) &&
									  (!is_base_triangle_vertex2_outer ||
									   (is_base_triangle_vertex2_outer && base_triangle_vertex2[2] == 0.0f)) &&
									  (!is_base_triangle_vertex3_outer ||
									   (is_base_triangle_vertex3_outer && base_triangle_vertex3[2] == 0.0f)));

							n_base_tess_level = 2;
						}
					} /* if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
					else
					{
						DE_ASSERT(primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS);

						std::size_t				  n_outer_edge_vertices = 0;
						std::vector<const float*> outer_edge_vertices;

						if (is_base_triangle_vertex1_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex1);
						}

						if (is_base_triangle_vertex2_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex2);
						}

						if (is_base_triangle_vertex3_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex3);
						}

						n_outer_edge_vertices = outer_edge_vertices.size();

						DE_ASSERT(n_outer_edge_vertices >= 1 && n_outer_edge_vertices <= 2);

						bool is_top_outer_edge	= true;
						bool is_right_outer_edge  = true;
						bool is_bottom_outer_edge = true;
						bool is_left_outer_edge   = true;

						/* Find which outer edges the vertices don't belong to. If one is in a corner,
						 * the other will clarify to which edge both vertices belong. */
						for (unsigned int n_vertex = 0; n_vertex < n_outer_edge_vertices; ++n_vertex)
						{
							/* Y < 1, not top outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1] - 1.0f) > epsilon)
							{
								is_top_outer_edge = false;
							}

							/* X < 1, not right outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0] - 1.0f) > epsilon)
							{
								is_right_outer_edge = false;
							}

							/* Y > 0, not bottom outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1]) > epsilon)
							{
								is_bottom_outer_edge = false;
							}

							/* X > 0, not left outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0]) > epsilon)
							{
								is_left_outer_edge = false;
							}
						}

						if (n_outer_edge_vertices == 1)
						{
							/* A single vertex with corner-coordinates belongs to two edges. Choose one */
							bool x_is_0 = de::abs(outer_edge_vertices[0][0]) < epsilon;
							bool x_is_1 = de::abs(outer_edge_vertices[0][0] - 1.0f) < epsilon;
							bool y_is_0 = de::abs(outer_edge_vertices[0][1]) < epsilon;
							bool y_is_1 = de::abs(outer_edge_vertices[0][1] - 1.0f) < epsilon;

							if (x_is_0 && y_is_0)
							{
								/* bottom edge */
								DE_ASSERT(is_left_outer_edge && is_bottom_outer_edge);
								is_left_outer_edge = false;
							}
							else if (x_is_0 && y_is_1)
							{
								/* left edge */
								DE_ASSERT(is_left_outer_edge && is_top_outer_edge);
								is_top_outer_edge = false;
							}
							else if (x_is_1 && y_is_0)
							{
								/* right edge */
								DE_ASSERT(is_right_outer_edge && is_bottom_outer_edge);
								is_bottom_outer_edge = false;
							}
							else if (x_is_1 && y_is_1)
							{
								/* top edge */
								DE_ASSERT(is_right_outer_edge && is_top_outer_edge);
								is_right_outer_edge = false;
							}
							else
							{
								/* Not a corner vertex, only one of the edge-flags is set */
							}
						}

						/* Sanity checks */
						DE_UNREF(is_top_outer_edge);
						DE_ASSERT((is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   is_right_outer_edge));

						/* We have all the data needed to determine which tessellation level describes
						 * subdivision of the edge that the triangle touches */
						if (is_left_outer_edge)
						{
							n_base_tess_level = 0;
						}
						else if (is_bottom_outer_edge)
						{
							n_base_tess_level = 1;
						}
						else if (is_right_outer_edge)
						{
							n_base_tess_level = 2;
						}
						else
						{
							n_base_tess_level = 3;
						}
					}

					/* We shouldn't perform the check if the edge we're processing was described
					 * by a different outer tessellation level in the reference data set */
					if (n_base_tess_level == ref_iteration.n_modified_outer_tess_level)
					{
						continue;
					}

					/* This triangle should be present in both vertex data sets */
					if (!isTriangleDefinedInVertexDataSet(base_triangle_data, ref_iteration_vertex_data,
														  ref_iteration.n_vertices))
					{
						const char* primitive_mode_str = (is_triangles_iteration) ? "triangles" : "quads";

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "] "
							<< ", inner tessellation levels:"
							<< "[" << base_iteration.inner_tess_levels[0] << ", " << base_iteration.inner_tess_levels[1]
							<< "], outer tessellation levels:"
							<< "[" << base_iteration.outer_tess_levels[0] << ", " << base_iteration.outer_tess_levels[1]
							<< ", " << base_iteration.outer_tess_levels[2] << ", "
							<< base_iteration.outer_tess_levels[3] << "], a triangle connecting inner & outer edges:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2] << "] was not found for runs using CW and CCW vertex ordering, "
														   "which is against the extension specification's rule 7."
							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation is not conformant with Tessellation Rule 7");
					}
				} /* for (all triangles generated for base test iteration) */
			}	 /* for (all reference iterations) */
		}		  /* for (all base test iterations) */
	}			  /* for (both primitive types) */
}